

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  uint uVar1;
  element_type *peVar2;
  __int_type _Var3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar9;
  pthread_mutex_t *__mutex;
  bool bVar10;
  ptr<snapshot_sync_ctx> pVar11;
  string local_88;
  ptr<peer> p;
  ptr<snapshot_sync_ctx> sync_ctx;
  ptr<snapshot> snp;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 4 < iVar7)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar9 = "not accepted";
    if (resp->accepted_ != false) {
      pcVar9 = "accepted";
    }
    msg_if_given_abi_cxx11_(&local_88,"%s\n",pcVar9);
    (*peVar2->_vptr_logger[8])
              (peVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp",0x148,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_88._M_dataplus._M_p._0_4_ = (resp->super_msg_base).src_;
  iVar8 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_88);
  if (iVar8.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      return;
    }
    iVar7 = (*peVar2->_vptr_logger[7])();
    if (iVar7 < 4) {
      return;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_88,"the response is from an unknown peer %d",
               (ulong)(uint)(resp->super_msg_base).src_);
    (*peVar2->_vptr_logger[8])
              (peVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp",0x14b,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    return;
  }
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)iVar8.
                    super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                    ._M_cur + 0x10));
  if (resp->accepted_ != true) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 2 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = (((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
      _Var3 = ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              next_log_idx_).super___atomic_base<unsigned_long>._M_i;
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                (&local_88,
                 "peer %d declined snapshot: p->get_next_log_idx(): %lu, log_store_->next_slot(): %lu"
                 ,(ulong)uVar1,_Var3,CONCAT44(extraout_var,iVar7));
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp",0x17d,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    LOCK();
    ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_).
    super___atomic_base<unsigned_long>._M_i = resp->next_idx_;
    UNLOCK();
    uVar4 = ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_)
            .super___atomic_base<unsigned_long>._M_i;
    iVar7 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    __mutex = (pthread_mutex_t *)
              &(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lock_;
    std::mutex::lock((mutex *)&__mutex->__data);
    bVar10 = uVar4 < CONCAT44(extraout_var_00,iVar7);
    clear_snapshot_sync_ctx
              (this,p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    goto LAB_001ca2d0;
  }
  __mutex = (pthread_mutex_t *)
            &(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lock_;
  std::mutex::lock((mutex *)&__mutex->__data);
  pVar11 = peer::get_snapshot_sync_ctx((peer *)&sync_ctx);
  if (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar7 = (*peVar2->_vptr_logger[7])
                          (peVar2,0,pVar11.
                                    super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._M_pi), 3 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_88,"no snapshot sync context for this peer, drop the response")
      ;
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp",0x157,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    bVar10 = false;
  }
  else {
    std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,
               &((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->snapshot_).
                super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>);
    if ((((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
          raw_binary) &&
        (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar2 != (element_type *)0x0)) && (iVar7 = (*peVar2->_vptr_logger[7])(), 4 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_88,"resp.get_next_idx(): %lu, snp->size(): %lu",resp->next_idx_,
                 (snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 size_);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp",0x15f,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
        logical_object) {
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 &(resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
      lVar5 = CONCAT44(local_88._M_dataplus._M_p._4_4_,(int32)local_88._M_dataplus._M_p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
      if (lVar5 == 0) goto LAB_001ca0b6;
LAB_001ca34c:
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 4 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_88,"snapshot sync is done (raw type)");
        (*peVar2->_vptr_logger[8])
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x16a,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      LOCK();
      ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_).
      super___atomic_base<unsigned_long>._M_i =
           (((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->last_log_idx_ + 1;
      UNLOCK();
      (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->matched_idx_ =
           (((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->last_log_idx_;
      clear_snapshot_sync_ctx
                (this,p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar6 = peer::clear_pending_commit
                        (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar10 = true;
      if (!bVar6) {
        uVar4 = ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                next_log_idx_).super___atomic_base<unsigned_long>._M_i;
        iVar7 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        bVar10 = uVar4 < CONCAT44(extraout_var_01,iVar7);
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_88,"snapshot done %lu, %lu, %d",
                   ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   next_log_idx_).super___atomic_base<unsigned_long>._M_i,
                   (p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   matched_idx_,(ulong)bVar10);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x172,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    else {
      if (((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
           raw_binary) &&
         ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size_ <=
          resp->next_idx_)) goto LAB_001ca34c;
LAB_001ca0b6:
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 4 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_88,"continue to sync snapshot at offset %lu",resp->next_idx_)
        ;
        (*peVar2->_vptr_logger[8])
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x175,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      bVar10 = true;
      snapshot_sync_ctx::set_offset
                (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,resp->next_idx_);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_001ca2d0:
  pthread_mutex_unlock(__mutex);
  if ((bVar10 != false) && ((this->role_)._M_i == leader)) {
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    request_append_entries(this,(ptr<peer> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp) {
    p_db("%s\n", resp.get_accepted() ? "accepted" : "not accepted");
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced,
    // continue to send appendEntries to this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted()) {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nullptr) {
            p_in("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;

        } else {
            ptr<snapshot> snp = sync_ctx->get_snapshot();
            if (snp->get_type() == snapshot::raw_binary) {
                // LCOV_EXCL_START
                p_db("resp.get_next_idx(): %" PRIu64 ", snp->size(): %" PRIu64,
                     resp.get_next_idx(), snp->size());
                // LCOV_EXCL_STOP
            }

            bool snp_install_done =
                 ( snp->get_type() == snapshot::raw_binary &&
                   resp.get_next_idx() >= snp->size() )           ||
                 ( snp->get_type() == snapshot::logical_object &&
                   resp.get_ctx() );

            if (snp_install_done) {
                p_db("snapshot sync is done (raw type)");
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                clear_snapshot_sync_ctx(*p);

                need_to_catchup = p->clear_pending_commit() ||
                                  p->get_next_log_idx() < log_store_->next_slot();
                p_in("snapshot done %" PRIu64 ", %" PRIu64 ", %d",
                     p->get_next_log_idx(), p->get_matched_idx(), need_to_catchup);
            } else {
                p_db("continue to sync snapshot at offset %" PRIu64,
                     resp.get_next_idx());
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }

    } else {
        p_wn( "peer %d declined snapshot: p->get_next_log_idx(): %" PRIu64 ", "
              "log_store_->next_slot(): %" PRIu64,
              p->get_id(), p->get_next_log_idx(), log_store_->next_slot() );
        p->set_next_log_idx(resp.get_next_idx());

        // Added by Jung-Sang Ahn (Oct 11 2017)
        // Declining snapshot implies that the peer already has the up-to-date snapshot.
        need_to_catchup = p->get_next_log_idx() < log_store_->next_slot();

        // Should reset current snapshot context,
        // to continue with more recent snapshot.
        std::lock_guard<std::mutex> guard(p->get_lock());
        clear_snapshot_sync_ctx(*p);
    }

    // This may not be a leader anymore, such as
    // the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup) {
        request_append_entries(p);
    }
}